

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::load_fromPostsolve(HModel *this,HPresolve *ptr_model)

{
  clearModel(this);
  copy_fromHPresolveToHModel(this,ptr_model);
  initScale(this);
  copy_basisFromPostsolve(this,ptr_model);
  initFromNonbasic(this);
  check_load_fromPostsolve(this);
  return;
}

Assistant:

void HModel::load_fromPostsolve(HPresolve * ptr_model) {
  clearModel();
  copy_fromHPresolveToHModel(ptr_model);
  initScale();
  copy_basisFromPostsolve(ptr_model);
  initFromNonbasic();
#ifdef JAJH_dev
  check_load_fromPostsolve();
#endif
}